

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

trust_token_method_st ** __thiscall
testing::internal::ValuesInIteratorRangeGenerator<const_trust_token_method_st_*>::Iterator::Current
          (Iterator *this)

{
  pointer pptVar1;
  reference pptVar2;
  Iterator *this_local;
  
  pptVar1 = std::
            unique_ptr<const_trust_token_method_st_*const,_std::default_delete<const_trust_token_method_st_*const>_>
            ::get(&this->value_);
  if (pptVar1 == (pointer)0x0) {
    pptVar1 = (pointer)operator_new(8);
    pptVar2 = __gnu_cxx::
              __normal_iterator<const_trust_token_method_st_*const_*,_std::vector<const_trust_token_method_st_*,_std::allocator<const_trust_token_method_st_*>_>_>
              ::operator*(&this->iterator_);
    *pptVar1 = *pptVar2;
    std::
    unique_ptr<const_trust_token_method_st_*const,_std::default_delete<const_trust_token_method_st_*const>_>
    ::reset(&this->value_,pptVar1);
  }
  pptVar1 = std::
            unique_ptr<const_trust_token_method_st_*const,_std::default_delete<const_trust_token_method_st_*const>_>
            ::get(&this->value_);
  return pptVar1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }